

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O2

double bsp_time(void)

{
  Spmd *pSVar1;
  time_t *in_RSI;
  double extraout_XMM0_Qa;
  timespec tStack_20;
  
  pSVar1 = s_spmd;
  if ((s_spmd != (Spmd *)0x0) && (s_spmd->m_closed != true)) {
    clock_gettime(1,&tStack_20);
    return (double)(tStack_20.tv_nsec - (pSVar1->m_time).tv_nsec) * 1e-09 +
           (double)(tStack_20.tv_sec - (pSVar1->m_time).tv_sec);
  }
  bsp_abort("bsp_time: can only be called within SPMD section\n");
  bsplib::Spmd::time(s_spmd,in_RSI);
  return extraout_XMM0_Qa;
}

Assistant:

double bsp_time()
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_time: can only be called within SPMD section\n");

    return s_spmd->time();
}